

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::greedilyOrientFaces(SurfaceMesh *this)

{
  Face e;
  Face e_00;
  Face e_01;
  Face e_02;
  Face f_00;
  bool bVar1;
  double *pdVar2;
  reference pvVar3;
  ParentMeshT *this_00;
  SurfaceMesh *this_01;
  Etype EVar4;
  Edge EVar5;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar6;
  Face fO;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end4;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin4;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range4;
  Face curr;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  FaceData<double> processed;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> toProcess;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> *in_stack_fffffffffffffd48;
  SurfaceMesh *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  size_t in_stack_fffffffffffffd60;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> *this_02;
  ParentMeshT *in_stack_fffffffffffffd68;
  double *in_stack_fffffffffffffd70;
  ParentMeshT *in_stack_fffffffffffffd78;
  MeshData<geometrycentral::surface::Face,_double> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  byte local_24a;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_158 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_128;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *local_100;
  ParentMeshT *local_f8;
  size_t sStack_f0;
  ParentMeshT *local_e8;
  SurfaceMesh *pSStack_e0;
  ParentMeshT *local_d8;
  ParentMeshT *pPVar7;
  SurfaceMesh *pSVar8;
  undefined1 local_88 [24];
  undefined1 *local_70;
  
  ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  vector((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> *)
         0x238f2c);
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(double)in_stack_fffffffffffffd70);
  faces(in_stack_fffffffffffffd50);
  local_70 = local_88;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd50);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd50);
  EVar6.ind = in_stack_fffffffffffffd60;
  EVar6.mesh = in_stack_fffffffffffffd68;
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    this_02 = (vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
               *)EVar6.ind;
    if (!bVar1) break;
    EVar4 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x238fd9);
    this_01 = (SurfaceMesh *)
              EVar4.
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              ind;
    local_d8 = EVar4.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               mesh;
    e.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffd70;
    e.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         EVar6.mesh;
    pPVar7 = local_d8;
    pSVar8 = this_01;
    pdVar2 = MeshData<geometrycentral::surface::Face,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Face,_double> *)EVar6.ind,e);
    if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                   *)EVar6.ind,
                  (value_type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      pSStack_e0 = pSVar8;
      local_e8 = pPVar7;
      e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
           = (size_t)in_stack_fffffffffffffd70;
      e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = EVar6.mesh;
      pPVar7 = local_e8;
      pSVar8 = pSStack_e0;
      pdVar2 = MeshData<geometrycentral::surface::Face,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Face,_double> *)EVar6.ind,e_00);
      *pdVar2 = 1.0;
      while (bVar1 = ::std::
                     vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                     ::empty((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                              *)EVar6.ind), ((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar3 = ::std::
                 vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                 ::back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                         *)in_stack_fffffffffffffd50);
        local_f8 = (pvVar3->
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   ).mesh;
        sStack_f0 = (pvVar3->
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    ).ind;
        ::std::
        vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
        pop_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                  *)0x23914d);
        Face::adjacentHalfedges((Face *)EVar6.ind);
        local_100 = &local_128;
        NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
                  ((NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
                   EVar6.ind);
        NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end
                  (local_158,local_100);
        while (bVar1 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                       ::operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                                     *)in_stack_fffffffffffffd50,
                                    (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                                     *)in_stack_fffffffffffffd48), bVar1) {
          NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator*
                    ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                      *)0x2391df);
          EVar5 = Halfedge::edge((Halfedge *)in_stack_fffffffffffffd50);
          this_00 = EVar5.
                    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                    .mesh;
          bVar1 = Edge::isBoundary((Edge *)CONCAT17(in_stack_fffffffffffffd9f,
                                                    in_stack_fffffffffffffd98));
          local_24a = 1;
          if (!bVar1) {
            Halfedge::edge((Halfedge *)in_stack_fffffffffffffd50);
            in_stack_fffffffffffffd9f = Edge::isManifold((Edge *)this_00);
            local_24a = in_stack_fffffffffffffd9f ^ 0xff;
          }
          if ((local_24a & 1) == 0) {
            Halfedge::sibling((Halfedge *)in_stack_fffffffffffffd50);
            Halfedge::face((Halfedge *)in_stack_fffffffffffffd50);
            e_01.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
                 = (size_t)in_stack_fffffffffffffd70;
            e_01.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh = EVar6.mesh;
            in_stack_fffffffffffffd70 =
                 MeshData<geometrycentral::surface::Face,_double>::operator[]
                           ((MeshData<geometrycentral::surface::Face,_double> *)EVar6.ind,e_01);
            if ((*in_stack_fffffffffffffd70 == 0.0) && (!NAN(*in_stack_fffffffffffffd70))) {
              EVar6 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                       )Halfedge::edge((Halfedge *)in_stack_fffffffffffffd50);
              in_stack_fffffffffffffd5f =
                   Edge::isOriented((Edge *)CONCAT17(in_stack_fffffffffffffd9f,
                                                     in_stack_fffffffffffffd98));
              if (((in_stack_fffffffffffffd5f ^ 0xff) & 1) != 0) {
                f_00.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .ind = (size_t)pSVar8;
                f_00.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .mesh = pPVar7;
                invertOrientation(this_01,f_00);
              }
              ::std::
              vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
              ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                           *)EVar6.ind,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
              e_02.
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              ind = (size_t)in_stack_fffffffffffffd70;
              e_02.
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh = EVar6.mesh;
              in_stack_fffffffffffffd50 =
                   (SurfaceMesh *)
                   MeshData<geometrycentral::surface::Face,_double>::operator[]
                             ((MeshData<geometrycentral::surface::Face,_double> *)EVar6.ind,e_02);
              in_stack_fffffffffffffd50->_vptr_SurfaceMesh = (_func_int **)0x3ff0000000000000;
            }
          }
          NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
          operator++((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                      *)in_stack_fffffffffffffd50);
        }
      }
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd50)
    ;
  }
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffd50);
  ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  ~vector(this_02);
  return;
}

Assistant:

void SurfaceMesh::greedilyOrientFaces() {
  // TODO this is only lightly tested. Write some better tests.
  std::vector<Face> toProcess;
  FaceData<double> processed(*this, false);
  for (Face f : faces()) {
    if (processed[f]) continue;

    // start a new search
    toProcess.push_back(f);
    processed[f] = true;

    // cover the whole component
    while (!toProcess.empty()) {
      Face curr = toProcess.back();
      toProcess.pop_back();

      for (Halfedge he : curr.adjacentHalfedges()) {
        if (he.edge().isBoundary() || !he.edge().isManifold()) continue;
        Face fO = he.sibling().face();
        if (processed[fO]) continue;

        if (!he.edge().isOriented()) {
          invertOrientation(fO);
        }

        toProcess.push_back(fO);
        processed[fO] = true;
      }
    }
  }
}